

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_simulation_helpers.hpp
# Opt level: O0

RateAdaptiveCode<unsigned_int> * __thiscall
LDPC4QKD::CodeSimulationHelpers::load_ldpc_from_json<bool,unsigned_int,unsigned_int>
          (RateAdaptiveCode<unsigned_int> *__return_storage_ptr__,CodeSimulationHelpers *this,
          string *json_file_path,string *rate_adaption_file_path)

{
  pointer *this_00;
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  runtime_error *prVar4;
  stringstream s_1;
  exception *e;
  stringstream s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_508;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d8;
  undefined1 local_4c0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rows_to_combine;
  undefined1 local_4a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rowval;
  vector<unsigned_int,_std::allocator<unsigned_int>_> colptr;
  undefined1 local_450 [8];
  json data;
  ifstream f;
  long local_228;
  ifstream fs;
  string *rate_adaption_file_path_local;
  string *json_file_path_local;
  
  std::ifstream::ifstream(&local_228,this,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Invalid file.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::ifstream::ifstream(&data.m_data.m_value,this,8);
  this_00 = &colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)this_00,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::ifstream&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)local_450,
             (basic_ifstream<char,_std::char_traits<char>_> *)&data.m_data.m_value.boolean,
             (parser_callback_t *)this_00,true,false);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
               *)&colptr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  pvVar3 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_450,"format");
  bVar2 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::operator==<const_char_*>(pvVar3,"BINCSCJSON");
  if (!bVar2) {
    pvVar3 = nlohmann::json_abi_v3_11_2::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)local_450,"format");
    bVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::operator==<const_char_*>(pvVar3,"COMPRESSED_SPARSE_COLUMN");
    if (!bVar2) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Unexpected format within json file.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar4,
               "Reading QC-exponents not supported yet! Use LDPCStorage.jl to convert to bincsc.json format!"
              );
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_450,"colptr");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator_vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar3);
  pvVar3 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)local_450,"rowval");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::operator_vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_0>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4a0,pvVar3);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (json_file_path);
  if (bVar2) {
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4a0);
    rows_to_combine.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    read_rate_adaption_from_csv<unsigned_int>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4c0,json_file_path);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_4d8,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_4f0,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4a0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_508,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4c0);
    RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
              (__return_storage_ptr__,&local_4d8,&local_4f0,&local_508,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_508);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4f0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4d8);
    rows_to_combine.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4c0);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &rowval.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)local_450);
  std::ifstream::~ifstream(&data.m_data.m_value);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

LDPC4QKD::RateAdaptiveCode<idx_t> load_ldpc_from_json(
            const std::string &json_file_path, const std::string &rate_adaption_file_path = ""
    ) {
        try {
            std::ifstream fs(json_file_path);
            if (!fs) {
                throw std::runtime_error("Invalid file.");
            }

            // parse JSON file
            using json = nlohmann::json;
            std::ifstream f(json_file_path);
            json data = json::parse(f);

            if (data["format"] == "BINCSCJSON") { // binary matrix stored
                std::vector<colptr_t> colptr = data["colptr"];
                std::vector<idx_t> rowval = data["rowval"];

                if (rate_adaption_file_path.empty()) {
                    return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, rowval);
                } else {
                    std::vector<idx_t> rows_to_combine = read_rate_adaption_from_csv<idx_t>(rate_adaption_file_path);
                    return LDPC4QKD::RateAdaptiveCode<idx_t>(colptr, rowval, rows_to_combine);
                }
            } else if (data["format"] == "COMPRESSED_SPARSE_COLUMN") { // quasi-cyclic exponents stored
//                std::vector<std::uint64_t> colptr = data["colptr"];
//                std::vector<std::uint64_t> rowval = data["rowval"];
//                std::vector<std::uint64_t> nzval = data["nzval"];
                    // TODO reconstructing the matrix from qc-exponents and storing as sparse needs some work...
                throw std::runtime_error("Reading QC-exponents not supported yet! Use LDPCStorage.jl to convert to bincsc.json format!");
            } else {
                throw std::runtime_error("Unexpected format within json file.");
            }
        } catch (const std::exception &e) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << json_file_path << "'. Reason:\n" << e.what() << "\n";
            throw std::runtime_error(s.str());
        } catch (...) {
            std::stringstream s;
            s << "Failed to read LDPC code from file '" << json_file_path << "' due to unknown error.";
            throw std::runtime_error(s.str());
        }
    }